

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O0

int reflect_damage(int *reflect,int damage)

{
  ostream *poVar1;
  int damage_local;
  int *reflect_local;
  
  if (*reflect == 2) {
    reflect_local._4_4_ = (int)((double)damage * 0.4);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_cd70);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,reflect_local._4_4_);
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_cd86);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    reflect_local._4_4_ = (int)((double)damage * 0.8);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_cd70);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,reflect_local._4_4_);
    poVar1 = std::operator<<(poVar1,anon_var_dwarf_cd86);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return reflect_local._4_4_;
}

Assistant:

int reflect_damage(int* reflect,int damage)
{
    if(*reflect==2)
    {
        damage *= 0.4;
        cout<<endl<<"勇者受到 "<<damage<<" 點反彈傷害"<<endl;
        return damage;
    }
    else
    {
        damage *= 0.4*2;
        cout<<endl<<"勇者受到 "<<damage<<" 點反彈傷害"<<endl;
        return damage;
    }
}